

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util_tests.cpp
# Opt level: O2

void __thiscall util_tests::util_overflow::test_method(util_overflow *this)

{
  iterator in_R8;
  iterator pvVar1;
  iterator pvVar2;
  iterator in_R9;
  uint *puVar3;
  uint *puVar4;
  undefined1 **ppuVar5;
  char **ppcVar6;
  long in_FS_OFFSET;
  const_string file;
  const_string file_00;
  const_string file_01;
  const_string file_02;
  const_string file_03;
  const_string file_04;
  const_string file_05;
  const_string file_06;
  const_string file_07;
  const_string file_08;
  const_string file_09;
  const_string file_10;
  const_string file_11;
  const_string file_12;
  const_string file_13;
  const_string file_14;
  const_string file_15;
  const_string file_16;
  const_string file_17;
  const_string file_18;
  const_string file_19;
  const_string file_20;
  const_string file_21;
  const_string file_22;
  const_string file_23;
  const_string file_24;
  const_string file_25;
  const_string file_26;
  const_string file_27;
  const_string file_28;
  const_string file_29;
  const_string file_30;
  const_string file_31;
  const_string file_32;
  const_string file_33;
  const_string file_34;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  const_string msg_02;
  const_string msg_03;
  const_string msg_04;
  const_string msg_05;
  const_string msg_06;
  const_string msg_07;
  const_string msg_08;
  const_string msg_09;
  const_string msg_10;
  const_string msg_11;
  const_string msg_12;
  const_string msg_13;
  const_string msg_14;
  const_string msg_15;
  const_string msg_16;
  const_string msg_17;
  const_string msg_18;
  const_string msg_19;
  const_string msg_20;
  const_string msg_21;
  const_string msg_22;
  const_string msg_23;
  const_string msg_24;
  const_string msg_25;
  const_string msg_26;
  const_string msg_27;
  const_string msg_28;
  const_string msg_29;
  const_string msg_30;
  const_string msg_31;
  const_string msg_32;
  const_string msg_33;
  const_string msg_34;
  check_type cVar7;
  undefined4 local_2b0;
  undefined4 local_2ac;
  char *local_2a8;
  char *local_2a0;
  undefined1 *local_298;
  undefined1 *local_290;
  char *local_288;
  char *local_280;
  char *local_278;
  char *local_270;
  undefined1 *local_268;
  undefined1 *local_260;
  char *local_258;
  char *local_250;
  char *local_248;
  char *local_240;
  undefined8 local_238;
  undefined1 *local_230;
  undefined8 local_228;
  char *local_220;
  char *local_218;
  char *local_210;
  undefined1 *local_208;
  undefined1 *local_200;
  char *local_1f8;
  char *local_1f0;
  undefined1 *local_1e8;
  undefined1 *local_1e0;
  char *local_1d8;
  char *local_1d0;
  undefined1 *local_1c8;
  undefined1 *local_1c0;
  char *local_1b8;
  char *local_1b0;
  undefined8 local_1a8;
  undefined1 *local_1a0;
  char *local_198;
  char *local_190;
  undefined1 *local_188;
  undefined1 *local_180;
  char *local_178;
  char *local_170;
  char *local_168;
  char *local_160;
  undefined1 *local_158;
  undefined1 *local_150;
  char *local_148;
  char *local_140;
  char *local_138;
  char *local_130;
  char *local_128;
  char *local_120;
  char *local_118;
  char *local_110;
  undefined1 *local_108;
  undefined1 *local_100;
  char *local_f8;
  char *local_f0;
  char *local_e8;
  char *local_e0;
  lazy_ostream local_d8;
  undefined1 *local_c8;
  char **local_c0;
  assertion_result local_b8;
  undefined1 *local_a0;
  undefined1 *local_98;
  char *local_90;
  char *local_88;
  uint MAXI;
  char *local_78;
  char *local_70;
  char *local_68;
  char *local_60;
  char *local_58;
  char *local_50;
  char *local_48;
  char *local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  MAXI = 0xffffffff;
  local_90 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_88 = "";
  local_a0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_98 = &boost::unit_test::basic_cstring<char_const>::null;
  _cVar7 = 0x59b3fe;
  file.m_end = (iterator)0x245;
  file.m_begin = (iterator)&local_90;
  msg.m_end = in_R9;
  msg.m_begin = in_R8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_a0,msg);
  local_b8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(class_property<bool>)0x1;
  local_b8.m_message.px = (element_type *)0x0;
  local_b8.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_c0 = &local_e8;
  local_e8 = "!CheckedAdd(T{1}, MAXI)";
  local_e0 = "";
  local_d8.m_empty = false;
  local_d8._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_011481f0;
  local_c8 = boost::unit_test::lazy_ostream::inst;
  local_f8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_f0 = "";
  pvVar1 = &DAT_00000001;
  pvVar2 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            (&local_b8,&local_d8,1,0,WARN,_cVar7,(size_t)&local_f8,0x245);
  boost::detail::shared_count::~shared_count(&local_b8.m_message.pn);
  local_e8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_e0 = "";
  local_108 = &boost::unit_test::basic_cstring<char_const>::null;
  local_100 = &boost::unit_test::basic_cstring<char_const>::null;
  _cVar7 = 0x59b4be;
  file_00.m_end = (iterator)0x246;
  file_00.m_begin = (iterator)&local_e8;
  msg_00.m_end = pvVar2;
  msg_00.m_begin = pvVar1;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_108,
             msg_00);
  local_b8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)0x1;
  local_b8.m_message.px = (element_type *)0x0;
  local_b8.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_c0 = &local_118;
  local_118 = "!CheckedAdd(MAXI, MAXI)";
  local_110 = "";
  local_d8.m_empty = false;
  local_d8._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_011481f0;
  local_c8 = boost::unit_test::lazy_ostream::inst;
  local_128 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_120 = "";
  pvVar1 = &DAT_00000001;
  pvVar2 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            (&local_b8,&local_d8,1,0,WARN,_cVar7,(size_t)&local_128,0x246);
  boost::detail::shared_count::~shared_count(&local_b8.m_message.pn);
  local_b8._0_8_ =
       "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_b8.m_message.px = (element_type *)0xc7e6e4;
  local_118 = "";
  local_110 = "";
  file_01.m_end = (iterator)0x247;
  file_01.m_begin = (iterator)&local_b8;
  msg_01.m_end = pvVar2;
  msg_01.m_begin = pvVar1;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,(size_t)&local_118,
             msg_01);
  local_d8.m_empty = false;
  local_d8._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_011480b0;
  local_c8 = boost::unit_test::lazy_ostream::inst;
  local_c0 = (char **)0xc7f1cc;
  local_138 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_130 = "";
  local_148 = (char *)CONCAT44(local_148._4_4_,0xffffffff);
  puVar3 = &MAXI;
  pvVar1 = (iterator)0x2;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_int,unsigned_int>
            (&local_d8,&local_138,0x247,1,2,puVar3,"MAXI",&local_148,"SaturatingAdd(T{1}, MAXI)");
  local_148 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_140 = "";
  local_158 = &boost::unit_test::basic_cstring<char_const>::null;
  local_150 = &boost::unit_test::basic_cstring<char_const>::null;
  file_02.m_end = (iterator)0x248;
  file_02.m_begin = (iterator)&local_148;
  msg_02.m_end = (iterator)puVar3;
  msg_02.m_begin = pvVar1;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_02,(size_t)&local_158,
             msg_02);
  local_d8.m_empty = false;
  local_d8._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_011480b0;
  local_c8 = boost::unit_test::lazy_ostream::inst;
  local_c0 = (char **)0xc7f1cc;
  local_168 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_160 = "";
  local_178 = (char *)CONCAT44(local_178._4_4_,0xffffffff);
  pvVar1 = (iterator)0x2;
  puVar3 = &MAXI;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_int,unsigned_int>
            (&local_d8,&local_168,0x248,1,2,puVar3,"MAXI",&local_178,"SaturatingAdd(MAXI, MAXI)");
  local_178 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_170 = "";
  local_188 = &boost::unit_test::basic_cstring<char_const>::null;
  local_180 = &boost::unit_test::basic_cstring<char_const>::null;
  file_03.m_end = (iterator)0x24a;
  file_03.m_begin = (iterator)&local_178;
  msg_03.m_end = (iterator)puVar3;
  msg_03.m_begin = pvVar1;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_03,(size_t)&local_188,
             msg_03);
  local_d8.m_empty = false;
  local_d8._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_011480b0;
  local_c8 = boost::unit_test::lazy_ostream::inst;
  local_c0 = (char **)0xc7f1cc;
  pvVar1 = (iterator)&local_1a8;
  local_1a8 = (undefined1 *)((ulong)local_1a8._4_4_ << 0x20);
  local_198 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_190 = "";
  local_48 = (char *)0x100000000;
  pvVar2 = (iterator)0x2;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,unsigned_int>
            (&local_d8,&local_198,0x24a,1,2,pvVar1,"0",&local_48,"CheckedAdd(T{0}, T{0}).value()");
  local_48 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_40 = "";
  local_1a8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1a0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_04.m_end = (iterator)0x24b;
  file_04.m_begin = (iterator)&local_48;
  msg_04.m_end = pvVar1;
  msg_04.m_begin = pvVar2;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_04,(size_t)&local_1a8,
             msg_04);
  local_d8.m_empty = false;
  local_d8._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_011480b0;
  local_c8 = boost::unit_test::lazy_ostream::inst;
  local_c0 = (char **)0xc7f1cc;
  local_1b8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_1b0 = "";
  local_58 = (char *)0x1ffffffff;
  pvVar1 = (iterator)0x2;
  puVar3 = &MAXI;
  puVar4 = puVar3;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_int,unsigned_int>
            (&local_d8,&local_1b8,0x24b,1,2,puVar3,"MAXI",&local_58,"CheckedAdd(T{0}, MAXI).value()"
            );
  local_58 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_50 = "";
  local_1c8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1c0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_05.m_end = (iterator)0x24c;
  file_05.m_begin = (iterator)&local_58;
  msg_05.m_end = (iterator)puVar4;
  msg_05.m_begin = pvVar1;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_05,(size_t)&local_1c8,
             msg_05);
  local_d8.m_empty = false;
  local_d8._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_011480b0;
  local_c8 = boost::unit_test::lazy_ostream::inst;
  local_c0 = (char **)0xc7f1cc;
  local_1d8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_1d0 = "";
  local_68 = (char *)0x1ffffffff;
  pvVar1 = (iterator)0x2;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_int,unsigned_int>
            (&local_d8,&local_1d8,0x24c,1,2,puVar3,"MAXI",&local_68,
             "CheckedAdd(T{1}, MAXI - 1).value()");
  local_68 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_60 = "";
  local_1e8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1e0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_06.m_end = (iterator)0x24d;
  file_06.m_begin = (iterator)&local_68;
  msg_06.m_end = (iterator)puVar3;
  msg_06.m_begin = pvVar1;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_06,(size_t)&local_1e8,
             msg_06);
  local_d8.m_empty = false;
  local_d8._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_011480b0;
  local_c8 = boost::unit_test::lazy_ostream::inst;
  local_c0 = (char **)0xc7f1cc;
  local_1f8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_1f0 = "";
  ppuVar5 = &local_208;
  local_208 = (undefined1 *)CONCAT44(local_208._4_4_,0xfffffffe);
  local_78 = (char *)0x1fffffffe;
  pvVar1 = (iterator)0x2;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_int,unsigned_int>
            (&local_d8,&local_1f8,0x24d,1,2,ppuVar5,"MAXI - 1",&local_78,
             "CheckedAdd(T{1}, MAXI - 2).value()");
  local_78 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_70 = "";
  local_208 = &boost::unit_test::basic_cstring<char_const>::null;
  local_200 = &boost::unit_test::basic_cstring<char_const>::null;
  file_07.m_end = (iterator)0x24e;
  file_07.m_begin = (iterator)&local_78;
  msg_07.m_end = (iterator)ppuVar5;
  msg_07.m_begin = pvVar1;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_07,(size_t)&local_208,
             msg_07);
  local_d8.m_empty = false;
  local_d8._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_011480b0;
  local_c8 = boost::unit_test::lazy_ostream::inst;
  local_c0 = (char **)0xc7f1cc;
  local_218 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_210 = "";
  pvVar1 = (iterator)&local_228;
  local_228 = (char *)((ulong)local_228._4_4_ << 0x20);
  local_238 = (undefined1 *)((ulong)local_238._4_4_ << 0x20);
  pvVar2 = (iterator)0x2;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,unsigned_int>
            (&local_d8,&local_218,0x24e,1,2,pvVar1,"0",&local_238,"SaturatingAdd(T{0}, T{0})");
  local_228 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_220 = "";
  local_238 = &boost::unit_test::basic_cstring<char_const>::null;
  local_230 = &boost::unit_test::basic_cstring<char_const>::null;
  file_08.m_end = (iterator)0x24f;
  file_08.m_begin = (iterator)&local_228;
  msg_08.m_end = pvVar1;
  msg_08.m_begin = pvVar2;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_08,(size_t)&local_238,
             msg_08);
  local_d8.m_empty = false;
  local_d8._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_011480b0;
  local_c8 = boost::unit_test::lazy_ostream::inst;
  local_c0 = (char **)0xc7f1cc;
  local_248 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_240 = "";
  local_258 = (char *)CONCAT44(local_258._4_4_,0xffffffff);
  pvVar1 = (iterator)0x2;
  puVar3 = &MAXI;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_int,unsigned_int>
            (&local_d8,&local_248,0x24f,1,2,puVar3,"MAXI",&local_258,"SaturatingAdd(T{0}, MAXI)");
  local_258 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_250 = "";
  local_268 = &boost::unit_test::basic_cstring<char_const>::null;
  local_260 = &boost::unit_test::basic_cstring<char_const>::null;
  file_09.m_end = (iterator)0x250;
  file_09.m_begin = (iterator)&local_258;
  msg_09.m_end = (iterator)puVar3;
  msg_09.m_begin = pvVar1;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_09,(size_t)&local_268,
             msg_09);
  local_d8.m_empty = false;
  local_d8._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_011480b0;
  local_c8 = boost::unit_test::lazy_ostream::inst;
  local_c0 = (char **)0xc7f1cc;
  local_278 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_270 = "";
  local_288 = (char *)CONCAT44(local_288._4_4_,0xffffffff);
  pvVar1 = (iterator)0x2;
  puVar3 = &MAXI;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_int,unsigned_int>
            (&local_d8,&local_278,0x250,1,2,puVar3,"MAXI",&local_288,"SaturatingAdd(T{1}, MAXI - 1)"
            );
  local_288 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_280 = "";
  local_298 = &boost::unit_test::basic_cstring<char_const>::null;
  local_290 = &boost::unit_test::basic_cstring<char_const>::null;
  file_10.m_end = (iterator)0x251;
  file_10.m_begin = (iterator)&local_288;
  msg_10.m_end = (iterator)puVar3;
  msg_10.m_begin = pvVar1;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_10,(size_t)&local_298,
             msg_10);
  local_d8.m_empty = false;
  local_d8._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_011480b0;
  local_c8 = boost::unit_test::lazy_ostream::inst;
  local_c0 = (char **)0xc7f1cc;
  local_2a8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_2a0 = "";
  pvVar1 = (iterator)&local_2ac;
  local_2b0 = 0xfffffffe;
  pvVar2 = (iterator)0x2;
  local_2ac = local_2b0;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_int,unsigned_int>
            (&local_d8,&local_2a8,0x251,1,2,pvVar1,"MAXI - 1",&local_2b0,
             "SaturatingAdd(T{1}, MAXI - 2)");
  MAXI = 0x7fffffff;
  local_90 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_88 = "";
  local_a0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_98 = &boost::unit_test::basic_cstring<char_const>::null;
  _cVar7 = 0x59bcda;
  file_11.m_end = (iterator)0x245;
  file_11.m_begin = (iterator)&local_90;
  msg_11.m_end = pvVar1;
  msg_11.m_begin = pvVar2;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_11,(size_t)&local_a0,msg_11
            );
  local_b8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(class_property<bool>)0x1;
  local_b8.m_message.px = (element_type *)0x0;
  local_b8.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_e8 = "!CheckedAdd(T{1}, MAXI)";
  local_e0 = "";
  local_d8.m_empty = false;
  local_d8._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_011481f0;
  local_c8 = boost::unit_test::lazy_ostream::inst;
  local_c0 = &local_e8;
  local_f8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_f0 = "";
  pvVar1 = &DAT_00000001;
  pvVar2 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            (&local_b8,&local_d8,1,0,WARN,_cVar7,(size_t)&local_f8,0x245);
  boost::detail::shared_count::~shared_count(&local_b8.m_message.pn);
  local_e8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_e0 = "";
  local_108 = &boost::unit_test::basic_cstring<char_const>::null;
  local_100 = &boost::unit_test::basic_cstring<char_const>::null;
  _cVar7 = 0x59bdb0;
  file_12.m_end = (iterator)0x246;
  file_12.m_begin = (iterator)&local_e8;
  msg_12.m_end = pvVar2;
  msg_12.m_begin = pvVar1;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_12,(size_t)&local_108,
             msg_12);
  local_b8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)0x1;
  local_b8.m_message.px = (element_type *)0x0;
  local_b8.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_118 = "!CheckedAdd(MAXI, MAXI)";
  local_110 = "";
  local_d8.m_empty = false;
  local_d8._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_011481f0;
  local_c8 = boost::unit_test::lazy_ostream::inst;
  local_c0 = &local_118;
  local_128 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_120 = "";
  pvVar1 = &DAT_00000001;
  pvVar2 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            (&local_b8,&local_d8,1,0,WARN,_cVar7,(size_t)&local_128,0x246);
  boost::detail::shared_count::~shared_count(&local_b8.m_message.pn);
  local_b8._0_8_ =
       "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_b8.m_message.px = (element_type *)0xc7e6e4;
  local_118 = "";
  local_110 = "";
  file_13.m_end = (iterator)0x247;
  file_13.m_begin = (iterator)&local_b8;
  msg_13.m_end = pvVar2;
  msg_13.m_begin = pvVar1;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_13,(size_t)&local_118,
             msg_13);
  local_d8.m_empty = false;
  local_d8._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_011480b0;
  local_c8 = boost::unit_test::lazy_ostream::inst;
  local_c0 = (char **)0xc7f1cc;
  local_138 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_130 = "";
  local_148 = (char *)CONCAT44(local_148._4_4_,0x7fffffff);
  pvVar1 = (iterator)0x2;
  puVar3 = &MAXI;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
            (&local_d8,&local_138,0x247,1,2,puVar3,"MAXI",&local_148,"SaturatingAdd(T{1}, MAXI)");
  local_148 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_140 = "";
  local_158 = &boost::unit_test::basic_cstring<char_const>::null;
  local_150 = &boost::unit_test::basic_cstring<char_const>::null;
  file_14.m_end = (iterator)0x248;
  file_14.m_begin = (iterator)&local_148;
  msg_14.m_end = (iterator)puVar3;
  msg_14.m_begin = pvVar1;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_14,(size_t)&local_158,
             msg_14);
  local_d8.m_empty = false;
  local_d8._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_011480b0;
  local_c8 = boost::unit_test::lazy_ostream::inst;
  local_c0 = (char **)0xc7f1cc;
  local_168 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_160 = "";
  local_178 = (char *)CONCAT44(local_178._4_4_,0x7fffffff);
  pvVar1 = (iterator)0x2;
  puVar3 = &MAXI;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
            (&local_d8,&local_168,0x248,1,2,puVar3,"MAXI",&local_178,"SaturatingAdd(MAXI, MAXI)");
  local_178 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_170 = "";
  local_188 = &boost::unit_test::basic_cstring<char_const>::null;
  local_180 = &boost::unit_test::basic_cstring<char_const>::null;
  file_15.m_end = (iterator)0x24a;
  file_15.m_begin = (iterator)&local_178;
  msg_15.m_end = (iterator)puVar3;
  msg_15.m_begin = pvVar1;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_15,(size_t)&local_188,
             msg_15);
  local_d8.m_empty = false;
  local_d8._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_011480b0;
  local_c8 = boost::unit_test::lazy_ostream::inst;
  local_c0 = (char **)0xc7f1cc;
  pvVar1 = (iterator)&local_1a8;
  local_1a8 = (undefined1 *)((ulong)local_1a8 & 0xffffffff00000000);
  local_198 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_190 = "";
  local_48 = (char *)0x100000000;
  pvVar2 = (iterator)0x2;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
            (&local_d8,&local_198,0x24a,1,2,pvVar1,"0",&local_48,"CheckedAdd(T{0}, T{0}).value()");
  local_48 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_40 = "";
  local_1a8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1a0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_16.m_end = (iterator)0x24b;
  file_16.m_begin = (iterator)&local_48;
  msg_16.m_end = pvVar1;
  msg_16.m_begin = pvVar2;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_16,(size_t)&local_1a8,
             msg_16);
  local_d8.m_empty = false;
  local_d8._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_011480b0;
  local_c8 = boost::unit_test::lazy_ostream::inst;
  local_c0 = (char **)0xc7f1cc;
  local_1b8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_1b0 = "";
  local_58 = (char *)0x17fffffff;
  pvVar1 = (iterator)0x2;
  puVar3 = &MAXI;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
            (&local_d8,&local_1b8,0x24b,1,2,puVar3,"MAXI",&local_58,"CheckedAdd(T{0}, MAXI).value()"
            );
  local_58 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_50 = "";
  local_1c8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1c0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_17.m_end = (iterator)0x24c;
  file_17.m_begin = (iterator)&local_58;
  msg_17.m_end = (iterator)puVar3;
  msg_17.m_begin = pvVar1;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_17,(size_t)&local_1c8,
             msg_17);
  local_d8.m_empty = false;
  local_d8._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_011480b0;
  local_c8 = boost::unit_test::lazy_ostream::inst;
  local_c0 = (char **)0xc7f1cc;
  local_1d8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_1d0 = "";
  local_68 = (char *)0x17fffffff;
  pvVar1 = (iterator)0x2;
  puVar3 = &MAXI;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
            (&local_d8,&local_1d8,0x24c,1,2,puVar3,"MAXI",&local_68,
             "CheckedAdd(T{1}, MAXI - 1).value()");
  local_68 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_60 = "";
  local_1e8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1e0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_18.m_end = (iterator)0x24d;
  file_18.m_begin = (iterator)&local_68;
  msg_18.m_end = (iterator)puVar3;
  msg_18.m_begin = pvVar1;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_18,(size_t)&local_1e8,
             msg_18);
  local_d8.m_empty = false;
  local_d8._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_011480b0;
  local_c8 = boost::unit_test::lazy_ostream::inst;
  local_c0 = (char **)0xc7f1cc;
  local_1f8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_1f0 = "";
  ppuVar5 = &local_208;
  local_208 = (undefined1 *)CONCAT44(local_208._4_4_,0x7ffffffe);
  local_78 = (char *)0x17ffffffe;
  pvVar1 = (iterator)0x2;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
            (&local_d8,&local_1f8,0x24d,1,2,ppuVar5,"MAXI - 1",&local_78,
             "CheckedAdd(T{1}, MAXI - 2).value()");
  local_78 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_70 = "";
  local_208 = &boost::unit_test::basic_cstring<char_const>::null;
  local_200 = &boost::unit_test::basic_cstring<char_const>::null;
  file_19.m_end = (iterator)0x24e;
  file_19.m_begin = (iterator)&local_78;
  msg_19.m_end = (iterator)ppuVar5;
  msg_19.m_begin = pvVar1;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_19,(size_t)&local_208,
             msg_19);
  local_d8.m_empty = false;
  local_d8._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_011480b0;
  local_c8 = boost::unit_test::lazy_ostream::inst;
  local_c0 = (char **)0xc7f1cc;
  local_218 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_210 = "";
  pvVar1 = (iterator)&local_228;
  local_228 = (char *)((ulong)local_228 & 0xffffffff00000000);
  local_238 = (undefined1 *)((ulong)local_238 & 0xffffffff00000000);
  pvVar2 = (iterator)0x2;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
            (&local_d8,&local_218,0x24e,1,2,pvVar1,"0",&local_238,"SaturatingAdd(T{0}, T{0})");
  local_228 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_220 = "";
  local_238 = &boost::unit_test::basic_cstring<char_const>::null;
  local_230 = &boost::unit_test::basic_cstring<char_const>::null;
  file_20.m_end = (iterator)0x24f;
  file_20.m_begin = (iterator)&local_228;
  msg_20.m_end = pvVar1;
  msg_20.m_begin = pvVar2;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_20,(size_t)&local_238,
             msg_20);
  local_d8.m_empty = false;
  local_d8._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_011480b0;
  local_c8 = boost::unit_test::lazy_ostream::inst;
  local_c0 = (char **)0xc7f1cc;
  local_248 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_240 = "";
  local_258 = (char *)CONCAT44(local_258._4_4_,0x7fffffff);
  pvVar1 = (iterator)0x2;
  puVar3 = &MAXI;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
            (&local_d8,&local_248,0x24f,1,2,puVar3,"MAXI",&local_258,"SaturatingAdd(T{0}, MAXI)");
  local_258 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_250 = "";
  local_268 = &boost::unit_test::basic_cstring<char_const>::null;
  local_260 = &boost::unit_test::basic_cstring<char_const>::null;
  file_21.m_end = (iterator)0x250;
  file_21.m_begin = (iterator)&local_258;
  msg_21.m_end = (iterator)puVar3;
  msg_21.m_begin = pvVar1;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_21,(size_t)&local_268,
             msg_21);
  local_d8.m_empty = false;
  local_d8._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_011480b0;
  local_c8 = boost::unit_test::lazy_ostream::inst;
  local_c0 = (char **)0xc7f1cc;
  local_278 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_270 = "";
  local_288 = (char *)CONCAT44(local_288._4_4_,0x7fffffff);
  pvVar1 = (iterator)0x2;
  puVar3 = &MAXI;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
            (&local_d8,&local_278,0x250,1,2,puVar3,"MAXI",&local_288,"SaturatingAdd(T{1}, MAXI - 1)"
            );
  local_288 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_280 = "";
  local_298 = &boost::unit_test::basic_cstring<char_const>::null;
  local_290 = &boost::unit_test::basic_cstring<char_const>::null;
  file_22.m_end = (iterator)0x251;
  file_22.m_begin = (iterator)&local_288;
  msg_22.m_end = (iterator)puVar3;
  msg_22.m_begin = pvVar1;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_22,(size_t)&local_298,
             msg_22);
  local_d8.m_empty = false;
  local_d8._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_011480b0;
  local_c8 = boost::unit_test::lazy_ostream::inst;
  local_c0 = (char **)0xc7f1cc;
  local_2a8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_2a0 = "";
  pvVar1 = (iterator)&local_2ac;
  local_2ac = 0x7ffffffe;
  local_2b0 = 0x7ffffffe;
  pvVar2 = (iterator)0x2;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
            (&local_d8,&local_2a8,0x251,1,2,pvVar1,"MAXI - 1",&local_2b0,
             "SaturatingAdd(T{1}, MAXI - 2)");
  MAXI = 0x80000000;
  local_90 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_88 = "";
  local_a0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_98 = &boost::unit_test::basic_cstring<char_const>::null;
  _cVar7 = 0x59c5f6;
  file_23.m_end = (iterator)0x25b;
  file_23.m_begin = (iterator)&local_90;
  msg_23.m_end = pvVar1;
  msg_23.m_begin = pvVar2;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_23,(size_t)&local_a0,msg_23
            );
  local_b8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(class_property<bool>)0x1;
  local_b8.m_message.px = (element_type *)0x0;
  local_b8.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_e8 = "!CheckedAdd(T{-1}, MINI)";
  local_e0 = "";
  local_d8.m_empty = false;
  local_d8._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_011481f0;
  local_c8 = boost::unit_test::lazy_ostream::inst;
  local_c0 = &local_e8;
  local_f8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_f0 = "";
  pvVar1 = &DAT_00000001;
  pvVar2 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            (&local_b8,&local_d8,1,0,WARN,_cVar7,(size_t)&local_f8,0x25b);
  boost::detail::shared_count::~shared_count(&local_b8.m_message.pn);
  local_e8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_e0 = "";
  local_108 = &boost::unit_test::basic_cstring<char_const>::null;
  local_100 = &boost::unit_test::basic_cstring<char_const>::null;
  _cVar7 = 0x59c6cc;
  file_24.m_end = (iterator)0x25c;
  file_24.m_begin = (iterator)&local_e8;
  msg_24.m_end = pvVar2;
  msg_24.m_begin = pvVar1;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_24,(size_t)&local_108,
             msg_24);
  local_b8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)0x1;
  local_b8.m_message.px = (element_type *)0x0;
  local_b8.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_118 = "!CheckedAdd(MINI, MINI)";
  local_110 = "";
  local_d8.m_empty = false;
  local_d8._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_011481f0;
  local_c8 = boost::unit_test::lazy_ostream::inst;
  local_c0 = &local_118;
  local_128 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_120 = "";
  pvVar1 = &DAT_00000001;
  pvVar2 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            (&local_b8,&local_d8,1,0,WARN,_cVar7,(size_t)&local_128,0x25c);
  boost::detail::shared_count::~shared_count(&local_b8.m_message.pn);
  local_b8._0_8_ =
       "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_b8.m_message.px = (element_type *)0xc7e6e4;
  local_118 = "";
  local_110 = "";
  file_25.m_end = (iterator)0x25d;
  file_25.m_begin = (iterator)&local_b8;
  msg_25.m_end = pvVar2;
  msg_25.m_begin = pvVar1;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_25,(size_t)&local_118,
             msg_25);
  local_d8.m_empty = false;
  local_d8._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_011480b0;
  local_c8 = boost::unit_test::lazy_ostream::inst;
  local_c0 = (char **)0xc7f1cc;
  local_138 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_130 = "";
  local_148 = (char *)CONCAT44(local_148._4_4_,0x80000000);
  pvVar1 = (iterator)0x2;
  puVar3 = &MAXI;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
            (&local_d8,&local_138,0x25d,1,2,puVar3,"MINI",&local_148,"SaturatingAdd(T{-1}, MINI)");
  local_148 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_140 = "";
  local_158 = &boost::unit_test::basic_cstring<char_const>::null;
  local_150 = &boost::unit_test::basic_cstring<char_const>::null;
  file_26.m_end = (iterator)0x25e;
  file_26.m_begin = (iterator)&local_148;
  msg_26.m_end = (iterator)puVar3;
  msg_26.m_begin = pvVar1;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_26,(size_t)&local_158,
             msg_26);
  local_d8.m_empty = false;
  local_d8._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_011480b0;
  local_c8 = boost::unit_test::lazy_ostream::inst;
  local_c0 = (char **)0xc7f1cc;
  local_168 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_160 = "";
  local_178 = (char *)CONCAT44(local_178._4_4_,0x80000000);
  pvVar1 = (iterator)0x2;
  puVar3 = &MAXI;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
            (&local_d8,&local_168,0x25e,1,2,puVar3,"MINI",&local_178,"SaturatingAdd(MINI, MINI)");
  local_178 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_170 = "";
  local_188 = &boost::unit_test::basic_cstring<char_const>::null;
  local_180 = &boost::unit_test::basic_cstring<char_const>::null;
  file_27.m_end = (iterator)0x260;
  file_27.m_begin = (iterator)&local_178;
  msg_27.m_end = (iterator)puVar3;
  msg_27.m_begin = pvVar1;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_27,(size_t)&local_188,
             msg_27);
  local_d8.m_empty = false;
  local_d8._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_011480b0;
  local_c8 = boost::unit_test::lazy_ostream::inst;
  local_c0 = (char **)0xc7f1cc;
  local_198 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_190 = "";
  local_48 = (char *)0x180000000;
  pvVar1 = (iterator)0x2;
  puVar3 = &MAXI;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
            (&local_d8,&local_198,0x260,1,2,puVar3,"MINI",&local_48,"CheckedAdd(T{0}, MINI).value()"
            );
  local_48 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_40 = "";
  local_1a8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1a0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_28.m_end = (iterator)0x261;
  file_28.m_begin = (iterator)&local_48;
  msg_28.m_end = (iterator)puVar3;
  msg_28.m_begin = pvVar1;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_28,(size_t)&local_1a8,
             msg_28);
  local_d8.m_empty = false;
  local_d8._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_011480b0;
  local_c8 = boost::unit_test::lazy_ostream::inst;
  local_c0 = (char **)0xc7f1cc;
  local_1b8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_1b0 = "";
  local_58 = (char *)0x180000000;
  pvVar1 = (iterator)0x2;
  puVar3 = &MAXI;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
            (&local_d8,&local_1b8,0x261,1,2,puVar3,"MINI",&local_58,
             "CheckedAdd(T{-1}, MINI + 1).value()");
  local_58 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_50 = "";
  local_1c8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1c0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_29.m_end = (iterator)0x262;
  file_29.m_begin = (iterator)&local_58;
  msg_29.m_end = (iterator)puVar3;
  msg_29.m_begin = pvVar1;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_29,(size_t)&local_1c8,
             msg_29);
  local_d8.m_empty = false;
  local_d8._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_011480b0;
  local_c8 = boost::unit_test::lazy_ostream::inst;
  local_c0 = (char **)0xc7f1cc;
  local_1d8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_1d0 = "";
  ppuVar5 = &local_1e8;
  local_1e8 = (undefined1 *)CONCAT44(local_1e8._4_4_,0xffffffff);
  local_68 = (char *)0x1ffffffff;
  pvVar1 = (iterator)0x2;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
            (&local_d8,&local_1d8,0x262,1,2,ppuVar5,"-1",&local_68,"CheckedAdd(MINI, MAXI).value()")
  ;
  local_68 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_60 = "";
  local_1e8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1e0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_30.m_end = (iterator)0x263;
  file_30.m_begin = (iterator)&local_68;
  msg_30.m_end = (iterator)ppuVar5;
  msg_30.m_begin = pvVar1;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_30,(size_t)&local_1e8,
             msg_30);
  local_d8.m_empty = false;
  local_d8._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_011480b0;
  local_c8 = boost::unit_test::lazy_ostream::inst;
  local_c0 = (char **)0xc7f1cc;
  local_1f8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_1f0 = "";
  ppuVar5 = &local_208;
  local_208 = (undefined1 *)CONCAT44(local_208._4_4_,0x80000001);
  local_78 = (char *)0x180000001;
  pvVar1 = (iterator)0x2;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
            (&local_d8,&local_1f8,0x263,1,2,ppuVar5,"MINI + 1",&local_78,
             "CheckedAdd(T{-1}, MINI + 2).value()");
  local_78 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_70 = "";
  local_208 = &boost::unit_test::basic_cstring<char_const>::null;
  local_200 = &boost::unit_test::basic_cstring<char_const>::null;
  file_31.m_end = (iterator)0x264;
  file_31.m_begin = (iterator)&local_78;
  msg_31.m_end = (iterator)ppuVar5;
  msg_31.m_begin = pvVar1;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_31,(size_t)&local_208,
             msg_31);
  local_d8.m_empty = false;
  local_d8._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_011480b0;
  local_c8 = boost::unit_test::lazy_ostream::inst;
  local_c0 = (char **)0xc7f1cc;
  local_218 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_210 = "";
  local_228 = (char *)CONCAT44(local_228._4_4_,0x80000000);
  pvVar1 = (iterator)0x2;
  puVar3 = &MAXI;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
            (&local_d8,&local_218,0x264,1,2,puVar3,"MINI",&local_228,"SaturatingAdd(T{0}, MINI)");
  local_228 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_220 = "";
  local_238 = &boost::unit_test::basic_cstring<char_const>::null;
  local_230 = &boost::unit_test::basic_cstring<char_const>::null;
  file_32.m_end = (iterator)0x265;
  file_32.m_begin = (iterator)&local_228;
  msg_32.m_end = (iterator)puVar3;
  msg_32.m_begin = pvVar1;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_32,(size_t)&local_238,
             msg_32);
  local_d8.m_empty = false;
  local_d8._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_011480b0;
  local_c8 = boost::unit_test::lazy_ostream::inst;
  local_c0 = (char **)0xc7f1cc;
  local_248 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_240 = "";
  local_258 = (char *)CONCAT44(local_258._4_4_,0x80000000);
  pvVar1 = (iterator)0x2;
  puVar3 = &MAXI;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
            (&local_d8,&local_248,0x265,1,2,puVar3,"MINI",&local_258,
             "SaturatingAdd(T{-1}, MINI + 1)");
  local_258 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_250 = "";
  local_268 = &boost::unit_test::basic_cstring<char_const>::null;
  local_260 = &boost::unit_test::basic_cstring<char_const>::null;
  file_33.m_end = (iterator)0x266;
  file_33.m_begin = (iterator)&local_258;
  msg_33.m_end = (iterator)puVar3;
  msg_33.m_begin = pvVar1;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_33,(size_t)&local_268,
             msg_33);
  local_d8.m_empty = false;
  local_d8._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_011480b0;
  local_c8 = boost::unit_test::lazy_ostream::inst;
  local_c0 = (char **)0xc7f1cc;
  local_278 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_270 = "";
  ppcVar6 = &local_288;
  local_288 = (char *)CONCAT44(local_288._4_4_,0x80000001);
  local_298 = (undefined1 *)CONCAT44(local_298._4_4_,0x80000001);
  pvVar1 = (iterator)0x2;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
            (&local_d8,&local_278,0x266,1,2,ppcVar6,"MINI + 1",&local_298,
             "SaturatingAdd(T{-1}, MINI + 2)");
  local_288 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_280 = "";
  local_298 = &boost::unit_test::basic_cstring<char_const>::null;
  local_290 = &boost::unit_test::basic_cstring<char_const>::null;
  file_34.m_end = (iterator)0x267;
  file_34.m_begin = (iterator)&local_288;
  msg_34.m_end = (iterator)ppcVar6;
  msg_34.m_begin = pvVar1;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_34,(size_t)&local_298,
             msg_34);
  local_d8.m_empty = false;
  local_d8._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_011480b0;
  local_c8 = boost::unit_test::lazy_ostream::inst;
  local_c0 = (char **)0xc7f1cc;
  local_2a8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_2ac = 0xffffffff;
  local_2a0 = "";
  local_2b0 = 0xffffffff;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
            (&local_d8,&local_2a8,0x267,1,2,&local_2ac,"-1",&local_2b0,"SaturatingAdd(MINI, MAXI)");
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(util_overflow)
{
    TestAddMatrixOverflow<unsigned>();
    TestAddMatrix<signed>();
}